

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

MovePtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactories,_de::DefaultDeleter<const_deqp::gls::BuiltinPrecisionTests::CaseFactories>_>
* deqp::gls::BuiltinPrecisionTests::createES3BuiltinCases(void)

{
  BuiltinFuncs *pBVar1;
  CaseFactory *pCVar2;
  MovePtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactories,_de::DefaultDeleter<const_deqp::gls::BuiltinPrecisionTests::CaseFactories>_>
  *in_RDI;
  DefaultDeleter<const_deqp::gls::BuiltinPrecisionTests::CaseFactories> local_7a1;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory> local_7a0;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory> local_790;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory> local_780;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory> local_770;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory> local_760;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory> local_750;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory> local_740;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory> local_730;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory> local_720;
  SharedPtr<deqp::gls::BuiltinPrecisionTests::SimpleFuncCaseFactory<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>_>
  local_710;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory> local_700;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory> local_6f0;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory> local_6e0;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory> local_6d0;
  allocator<char> local_6b9;
  string local_6b8;
  allocator<char> local_691;
  string local_690;
  allocator<char> local_669;
  string local_668;
  allocator<char> local_641;
  string local_640;
  allocator<char> local_619;
  string local_618;
  allocator<char> local_5f1;
  string local_5f0;
  SharedPtr<deqp::gls::BuiltinPrecisionTests::SimpleFuncCaseFactory<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>_>
  local_5d0;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory> local_5c0;
  allocator<char> local_5a9;
  string local_5a8;
  allocator<char> local_581;
  string local_580;
  allocator<char> local_559;
  string local_558;
  allocator<char> local_531;
  string local_530;
  allocator<char> local_509;
  string local_508;
  allocator<char> local_4e1;
  string local_4e0;
  allocator<char> local_4b9;
  string local_4b8;
  allocator<char> local_491;
  string local_490;
  allocator<char> local_469;
  string local_468;
  allocator<char> local_441;
  string local_440;
  allocator<char> local_419;
  string local_418;
  allocator<char> local_3f1;
  string local_3f0;
  allocator<char> local_3c9;
  string local_3c8;
  allocator<char> local_3a1;
  string local_3a0;
  allocator<char> local_379;
  string local_378;
  allocator<char> local_351;
  string local_350;
  allocator<char> local_329;
  string local_328;
  allocator<char> local_301;
  string local_300;
  allocator<char> local_2d9;
  string local_2d8;
  allocator<char> local_2b1;
  string local_2b0;
  allocator<char> local_289;
  string local_288;
  allocator<char> local_261;
  string local_260;
  allocator<char> local_239;
  string local_238;
  allocator<char> local_211;
  string local_210;
  allocator<char> local_1e9;
  string local_1e8;
  allocator<char> local_1c1;
  string local_1c0;
  allocator<char> local_199;
  string local_198;
  allocator<char> local_171;
  string local_170;
  allocator<char> local_149;
  string local_148;
  allocator<char> local_121;
  string local_120;
  allocator<char> local_f9;
  string local_f8;
  allocator<char> local_d1;
  string local_d0;
  allocator<char> local_a9;
  string local_a8;
  allocator<char> local_81;
  string local_80;
  allocator<char> local_49;
  string local_48;
  DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs> local_21;
  undefined1 local_20 [8];
  MovePtr<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
  funcs;
  
  pBVar1 = (BuiltinFuncs *)operator_new(0x20);
  (pBVar1->m_factories).
  super__Vector_base<de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>,_std::allocator<de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pBVar1->m_factories).
  super__Vector_base<de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>,_std::allocator<de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pBVar1->super_CaseFactories)._vptr_CaseFactories = (_func_int **)0x0;
  (pBVar1->m_factories).
  super__Vector_base<de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>,_std::allocator<de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  BuiltinFuncs::BuiltinFuncs(pBVar1);
  de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>::DefaultDeleter(&local_21);
  de::details::
  MovePtr<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
  ::MovePtr((MovePtr<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
             *)local_20,pBVar1);
  pBVar1 = de::details::
           UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           ::operator*((UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
                        *)local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"",&local_49);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::Add>(pBVar1,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  pBVar1 = de::details::
           UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           ::operator*((UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
                        *)local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"",&local_81);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::Sub>(pBVar1,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  pBVar1 = de::details::
           UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           ::operator*((UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
                        *)local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"",&local_a9);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::Mul>(pBVar1,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator(&local_a9);
  pBVar1 = de::details::
           UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           ::operator*((UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
                        *)local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"",&local_d1);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::Div>(pBVar1,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator(&local_d1);
  pBVar1 = de::details::
           UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           ::operator*((UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
                        *)local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"",&local_f9);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::Radians>(pBVar1,&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator(&local_f9);
  pBVar1 = de::details::
           UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           ::operator*((UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
                        *)local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,"",&local_121);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::Degrees>(pBVar1,&local_120);
  std::__cxx11::string::~string((string *)&local_120);
  std::allocator<char>::~allocator(&local_121);
  pBVar1 = de::details::
           UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           ::operator*((UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
                        *)local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_148,"",&local_149);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::Sin>(pBVar1,&local_148);
  std::__cxx11::string::~string((string *)&local_148);
  std::allocator<char>::~allocator(&local_149);
  pBVar1 = de::details::
           UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           ::operator*((UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
                        *)local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_170,"",&local_171);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::Cos>(pBVar1,&local_170);
  std::__cxx11::string::~string((string *)&local_170);
  std::allocator<char>::~allocator(&local_171);
  pBVar1 = de::details::
           UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           ::operator*((UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
                        *)local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_198,"",&local_199);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::Tan>(pBVar1,&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  std::allocator<char>::~allocator(&local_199);
  pBVar1 = de::details::
           UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           ::operator*((UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
                        *)local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c0,"",&local_1c1);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::ASin>(pBVar1,&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::allocator<char>::~allocator(&local_1c1);
  pBVar1 = de::details::
           UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           ::operator*((UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
                        *)local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e8,"",&local_1e9);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::ACos>(pBVar1,&local_1e8);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::allocator<char>::~allocator(&local_1e9);
  pBVar1 = de::details::
           UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           ::operator*((UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
                        *)local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_210,"atan2",&local_211);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::ATan2>(pBVar1,&local_210);
  std::__cxx11::string::~string((string *)&local_210);
  std::allocator<char>::~allocator(&local_211);
  pBVar1 = de::details::
           UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           ::operator*((UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
                        *)local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_238,"",&local_239);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::ATan>(pBVar1,&local_238);
  std::__cxx11::string::~string((string *)&local_238);
  std::allocator<char>::~allocator(&local_239);
  pBVar1 = de::details::
           UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           ::operator*((UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
                        *)local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_260,"",&local_261);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::Sinh>(pBVar1,&local_260);
  std::__cxx11::string::~string((string *)&local_260);
  std::allocator<char>::~allocator(&local_261);
  pBVar1 = de::details::
           UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           ::operator*((UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
                        *)local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_288,"",&local_289);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::Cosh>(pBVar1,&local_288);
  std::__cxx11::string::~string((string *)&local_288);
  std::allocator<char>::~allocator(&local_289);
  pBVar1 = de::details::
           UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           ::operator*((UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
                        *)local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b0,"",&local_2b1);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::Tanh>(pBVar1,&local_2b0);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::allocator<char>::~allocator(&local_2b1);
  pBVar1 = de::details::
           UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           ::operator*((UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
                        *)local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d8,"",&local_2d9);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::ASinh>(pBVar1,&local_2d8);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::allocator<char>::~allocator(&local_2d9);
  pBVar1 = de::details::
           UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           ::operator*((UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
                        *)local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_300,"",&local_301);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::ACosh>(pBVar1,&local_300);
  std::__cxx11::string::~string((string *)&local_300);
  std::allocator<char>::~allocator(&local_301);
  pBVar1 = de::details::
           UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           ::operator*((UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
                        *)local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_328,"",&local_329);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::ATanh>(pBVar1,&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  std::allocator<char>::~allocator(&local_329);
  pBVar1 = de::details::
           UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           ::operator*((UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
                        *)local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_350,"",&local_351);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::Pow>(pBVar1,&local_350);
  std::__cxx11::string::~string((string *)&local_350);
  std::allocator<char>::~allocator(&local_351);
  pBVar1 = de::details::
           UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           ::operator*((UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
                        *)local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_378,"",&local_379);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::Exp>(pBVar1,&local_378);
  std::__cxx11::string::~string((string *)&local_378);
  std::allocator<char>::~allocator(&local_379);
  pBVar1 = de::details::
           UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           ::operator*((UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
                        *)local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3a0,"",&local_3a1);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::Log>(pBVar1,&local_3a0);
  std::__cxx11::string::~string((string *)&local_3a0);
  std::allocator<char>::~allocator(&local_3a1);
  pBVar1 = de::details::
           UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           ::operator*((UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
                        *)local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c8,"",&local_3c9);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::Exp2>(pBVar1,&local_3c8);
  std::__cxx11::string::~string((string *)&local_3c8);
  std::allocator<char>::~allocator(&local_3c9);
  pBVar1 = de::details::
           UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           ::operator*((UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
                        *)local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3f0,"",&local_3f1);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::Log2>(pBVar1,&local_3f0);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::allocator<char>::~allocator(&local_3f1);
  pBVar1 = de::details::
           UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           ::operator*((UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
                        *)local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_418,"",&local_419);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::Sqrt>(pBVar1,&local_418);
  std::__cxx11::string::~string((string *)&local_418);
  std::allocator<char>::~allocator(&local_419);
  pBVar1 = de::details::
           UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           ::operator*((UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
                        *)local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_440,"",&local_441);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::InverseSqrt>(pBVar1,&local_440);
  std::__cxx11::string::~string((string *)&local_440);
  std::allocator<char>::~allocator(&local_441);
  pBVar1 = de::details::
           UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           ::operator*((UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
                        *)local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_468,"",&local_469);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::Abs>(pBVar1,&local_468);
  std::__cxx11::string::~string((string *)&local_468);
  std::allocator<char>::~allocator(&local_469);
  pBVar1 = de::details::
           UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           ::operator*((UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
                        *)local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_490,"",&local_491);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::Sign>(pBVar1,&local_490);
  std::__cxx11::string::~string((string *)&local_490);
  std::allocator<char>::~allocator(&local_491);
  pBVar1 = de::details::
           UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           ::operator*((UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
                        *)local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4b8,"",&local_4b9);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::Floor>(pBVar1,&local_4b8);
  std::__cxx11::string::~string((string *)&local_4b8);
  std::allocator<char>::~allocator(&local_4b9);
  pBVar1 = de::details::
           UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           ::operator*((UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
                        *)local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4e0,"",&local_4e1);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::Trunc>(pBVar1,&local_4e0);
  std::__cxx11::string::~string((string *)&local_4e0);
  std::allocator<char>::~allocator(&local_4e1);
  pBVar1 = de::details::
           UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           ::operator*((UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
                        *)local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_508,"",&local_509);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::Round>(pBVar1,&local_508);
  std::__cxx11::string::~string((string *)&local_508);
  std::allocator<char>::~allocator(&local_509);
  pBVar1 = de::details::
           UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           ::operator*((UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
                        *)local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_530,"",&local_531);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::RoundEven>(pBVar1,&local_530);
  std::__cxx11::string::~string((string *)&local_530);
  std::allocator<char>::~allocator(&local_531);
  pBVar1 = de::details::
           UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           ::operator*((UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
                        *)local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_558,"",&local_559);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::Ceil>(pBVar1,&local_558);
  std::__cxx11::string::~string((string *)&local_558);
  std::allocator<char>::~allocator(&local_559);
  pBVar1 = de::details::
           UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           ::operator*((UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
                        *)local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_580,"",&local_581);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::Fract>(pBVar1,&local_580);
  std::__cxx11::string::~string((string *)&local_580);
  std::allocator<char>::~allocator(&local_581);
  pBVar1 = de::details::
           UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           ::operator*((UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
                        *)local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5a8,"",&local_5a9);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::Mod>(pBVar1,&local_5a8);
  std::__cxx11::string::~string((string *)&local_5a8);
  std::allocator<char>::~allocator(&local_5a9);
  pBVar1 = de::details::
           UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           ::operator->((UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
                         *)local_20);
  createSimpleFuncCaseFactory<deqp::gls::BuiltinPrecisionTests::Functions::Modf>();
  de::SharedPtr::operator_cast_to_SharedPtr((SharedPtr *)&local_5c0);
  BuiltinFuncs::addFactory(pBVar1,&local_5c0);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>::~SharedPtr(&local_5c0);
  de::
  SharedPtr<deqp::gls::BuiltinPrecisionTests::SimpleFuncCaseFactory<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>_>
  ::~SharedPtr(&local_5d0);
  pBVar1 = de::details::
           UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           ::operator*((UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
                        *)local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5f0,"",&local_5f1);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::Min>(pBVar1,&local_5f0);
  std::__cxx11::string::~string((string *)&local_5f0);
  std::allocator<char>::~allocator(&local_5f1);
  pBVar1 = de::details::
           UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           ::operator*((UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
                        *)local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_618,"",&local_619);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::Max>(pBVar1,&local_618);
  std::__cxx11::string::~string((string *)&local_618);
  std::allocator<char>::~allocator(&local_619);
  pBVar1 = de::details::
           UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           ::operator*((UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
                        *)local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_640,"",&local_641);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::Clamp>(pBVar1,&local_640);
  std::__cxx11::string::~string((string *)&local_640);
  std::allocator<char>::~allocator(&local_641);
  pBVar1 = de::details::
           UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           ::operator*((UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
                        *)local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_668,"",&local_669);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::Mix>(pBVar1,&local_668);
  std::__cxx11::string::~string((string *)&local_668);
  std::allocator<char>::~allocator(&local_669);
  pBVar1 = de::details::
           UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           ::operator*((UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
                        *)local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_690,"",&local_691);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::Step>(pBVar1,&local_690);
  std::__cxx11::string::~string((string *)&local_690);
  std::allocator<char>::~allocator(&local_691);
  pBVar1 = de::details::
           UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           ::operator*((UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
                        *)local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6b8,"",&local_6b9);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::SmoothStep>(pBVar1,&local_6b8);
  std::__cxx11::string::~string((string *)&local_6b8);
  std::allocator<char>::~allocator(&local_6b9);
  pBVar1 = de::details::
           UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           ::operator->((UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
                         *)local_20);
  pCVar2 = (CaseFactory *)operator_new(8);
  pCVar2->_vptr_CaseFactory = (_func_int **)0x0;
  TemplateFuncCaseFactory<deqp::gls::BuiltinPrecisionTests::Functions::Length>::
  TemplateFuncCaseFactory
            ((TemplateFuncCaseFactory<deqp::gls::BuiltinPrecisionTests::Functions::Length> *)pCVar2)
  ;
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>::SharedPtr(&local_6d0,pCVar2);
  BuiltinFuncs::addFactory(pBVar1,&local_6d0);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>::~SharedPtr(&local_6d0);
  pBVar1 = de::details::
           UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           ::operator->((UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
                         *)local_20);
  pCVar2 = (CaseFactory *)operator_new(8);
  pCVar2->_vptr_CaseFactory = (_func_int **)0x0;
  TemplateFuncCaseFactory<deqp::gls::BuiltinPrecisionTests::Functions::Distance>::
  TemplateFuncCaseFactory
            ((TemplateFuncCaseFactory<deqp::gls::BuiltinPrecisionTests::Functions::Distance> *)
             pCVar2);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>::SharedPtr(&local_6e0,pCVar2);
  BuiltinFuncs::addFactory(pBVar1,&local_6e0);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>::~SharedPtr(&local_6e0);
  pBVar1 = de::details::
           UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           ::operator->((UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
                         *)local_20);
  pCVar2 = (CaseFactory *)operator_new(8);
  pCVar2->_vptr_CaseFactory = (_func_int **)0x0;
  TemplateFuncCaseFactory<deqp::gls::BuiltinPrecisionTests::Functions::Dot>::TemplateFuncCaseFactory
            ((TemplateFuncCaseFactory<deqp::gls::BuiltinPrecisionTests::Functions::Dot> *)pCVar2);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>::SharedPtr(&local_6f0,pCVar2);
  BuiltinFuncs::addFactory(pBVar1,&local_6f0);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>::~SharedPtr(&local_6f0);
  pBVar1 = de::details::
           UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           ::operator->((UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
                         *)local_20);
  createSimpleFuncCaseFactory<deqp::gls::BuiltinPrecisionTests::Functions::Cross>();
  de::SharedPtr::operator_cast_to_SharedPtr((SharedPtr *)&local_700);
  BuiltinFuncs::addFactory(pBVar1,&local_700);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>::~SharedPtr(&local_700);
  de::
  SharedPtr<deqp::gls::BuiltinPrecisionTests::SimpleFuncCaseFactory<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>_>
  ::~SharedPtr(&local_710);
  pBVar1 = de::details::
           UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           ::operator->((UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
                         *)local_20);
  pCVar2 = (CaseFactory *)operator_new(8);
  pCVar2->_vptr_CaseFactory = (_func_int **)0x0;
  TemplateFuncCaseFactory<deqp::gls::BuiltinPrecisionTests::Functions::Normalize>::
  TemplateFuncCaseFactory
            ((TemplateFuncCaseFactory<deqp::gls::BuiltinPrecisionTests::Functions::Normalize> *)
             pCVar2);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>::SharedPtr(&local_720,pCVar2);
  BuiltinFuncs::addFactory(pBVar1,&local_720);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>::~SharedPtr(&local_720);
  pBVar1 = de::details::
           UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           ::operator->((UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
                         *)local_20);
  pCVar2 = (CaseFactory *)operator_new(8);
  pCVar2->_vptr_CaseFactory = (_func_int **)0x0;
  TemplateFuncCaseFactory<deqp::gls::BuiltinPrecisionTests::Functions::FaceForward>::
  TemplateFuncCaseFactory
            ((TemplateFuncCaseFactory<deqp::gls::BuiltinPrecisionTests::Functions::FaceForward> *)
             pCVar2);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>::SharedPtr(&local_730,pCVar2);
  BuiltinFuncs::addFactory(pBVar1,&local_730);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>::~SharedPtr(&local_730);
  pBVar1 = de::details::
           UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           ::operator->((UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
                         *)local_20);
  pCVar2 = (CaseFactory *)operator_new(8);
  pCVar2->_vptr_CaseFactory = (_func_int **)0x0;
  TemplateFuncCaseFactory<deqp::gls::BuiltinPrecisionTests::Functions::Reflect>::
  TemplateFuncCaseFactory
            ((TemplateFuncCaseFactory<deqp::gls::BuiltinPrecisionTests::Functions::Reflect> *)pCVar2
            );
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>::SharedPtr(&local_740,pCVar2);
  BuiltinFuncs::addFactory(pBVar1,&local_740);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>::~SharedPtr(&local_740);
  pBVar1 = de::details::
           UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           ::operator->((UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
                         *)local_20);
  pCVar2 = (CaseFactory *)operator_new(8);
  pCVar2->_vptr_CaseFactory = (_func_int **)0x0;
  TemplateFuncCaseFactory<deqp::gls::BuiltinPrecisionTests::Functions::Refract>::
  TemplateFuncCaseFactory
            ((TemplateFuncCaseFactory<deqp::gls::BuiltinPrecisionTests::Functions::Refract> *)pCVar2
            );
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>::SharedPtr(&local_750,pCVar2);
  BuiltinFuncs::addFactory(pBVar1,&local_750);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>::~SharedPtr(&local_750);
  pBVar1 = de::details::
           UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           ::operator->((UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
                         *)local_20);
  pCVar2 = (CaseFactory *)operator_new(8);
  pCVar2->_vptr_CaseFactory = (_func_int **)0x0;
  MatrixFuncCaseFactory<deqp::gls::BuiltinPrecisionTests::Functions::MatrixCompMult>::
  MatrixFuncCaseFactory
            ((MatrixFuncCaseFactory<deqp::gls::BuiltinPrecisionTests::Functions::MatrixCompMult> *)
             pCVar2);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>::SharedPtr(&local_760,pCVar2);
  BuiltinFuncs::addFactory(pBVar1,&local_760);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>::~SharedPtr(&local_760);
  pBVar1 = de::details::
           UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           ::operator->((UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
                         *)local_20);
  pCVar2 = (CaseFactory *)operator_new(8);
  pCVar2->_vptr_CaseFactory = (_func_int **)0x0;
  MatrixFuncCaseFactory<deqp::gls::BuiltinPrecisionTests::Functions::OuterProduct>::
  MatrixFuncCaseFactory
            ((MatrixFuncCaseFactory<deqp::gls::BuiltinPrecisionTests::Functions::OuterProduct> *)
             pCVar2);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>::SharedPtr(&local_770,pCVar2);
  BuiltinFuncs::addFactory(pBVar1,&local_770);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>::~SharedPtr(&local_770);
  pBVar1 = de::details::
           UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           ::operator->((UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
                         *)local_20);
  pCVar2 = (CaseFactory *)operator_new(8);
  pCVar2->_vptr_CaseFactory = (_func_int **)0x0;
  MatrixFuncCaseFactory<deqp::gls::BuiltinPrecisionTests::Functions::Transpose>::
  MatrixFuncCaseFactory
            ((MatrixFuncCaseFactory<deqp::gls::BuiltinPrecisionTests::Functions::Transpose> *)pCVar2
            );
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>::SharedPtr(&local_780,pCVar2);
  BuiltinFuncs::addFactory(pBVar1,&local_780);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>::~SharedPtr(&local_780);
  pBVar1 = de::details::
           UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           ::operator->((UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
                         *)local_20);
  pCVar2 = (CaseFactory *)operator_new(8);
  pCVar2->_vptr_CaseFactory = (_func_int **)0x0;
  SquareMatrixFuncCaseFactory<deqp::gls::BuiltinPrecisionTests::Functions::Determinant>::
  SquareMatrixFuncCaseFactory
            ((SquareMatrixFuncCaseFactory<deqp::gls::BuiltinPrecisionTests::Functions::Determinant>
              *)pCVar2);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>::SharedPtr(&local_790,pCVar2);
  BuiltinFuncs::addFactory(pBVar1,&local_790);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>::~SharedPtr(&local_790);
  pBVar1 = de::details::
           UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           ::operator->((UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
                         *)local_20);
  pCVar2 = (CaseFactory *)operator_new(8);
  pCVar2->_vptr_CaseFactory = (_func_int **)0x0;
  SquareMatrixFuncCaseFactory<deqp::gls::BuiltinPrecisionTests::Functions::Inverse>::
  SquareMatrixFuncCaseFactory
            ((SquareMatrixFuncCaseFactory<deqp::gls::BuiltinPrecisionTests::Functions::Inverse> *)
             pCVar2);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>::SharedPtr(&local_7a0,pCVar2);
  BuiltinFuncs::addFactory(pBVar1,&local_7a0);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>::~SharedPtr(&local_7a0);
  pBVar1 = de::details::
           MovePtr<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           ::release((MovePtr<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
                      *)local_20);
  de::DefaultDeleter<const_deqp::gls::BuiltinPrecisionTests::CaseFactories>::DefaultDeleter
            (&local_7a1);
  de::details::
  MovePtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactories,_de::DefaultDeleter<const_deqp::gls::BuiltinPrecisionTests::CaseFactories>_>
  ::MovePtr(in_RDI,pBVar1);
  de::details::
  MovePtr<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
  ::~MovePtr((MovePtr<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
              *)local_20);
  return in_RDI;
}

Assistant:

MovePtr<const CaseFactories> createES3BuiltinCases (void)
{
	MovePtr<BuiltinFuncs>	funcs	(new BuiltinFuncs());

	addScalarFactory<Add>(*funcs);
	addScalarFactory<Sub>(*funcs);
	addScalarFactory<Mul>(*funcs);
	addScalarFactory<Div>(*funcs);

	addScalarFactory<Radians>(*funcs);
	addScalarFactory<Degrees>(*funcs);
	addScalarFactory<Sin>(*funcs);
	addScalarFactory<Cos>(*funcs);
	addScalarFactory<Tan>(*funcs);
	addScalarFactory<ASin>(*funcs);
	addScalarFactory<ACos>(*funcs);
	addScalarFactory<ATan2>(*funcs, "atan2");
	addScalarFactory<ATan>(*funcs);
	addScalarFactory<Sinh>(*funcs);
	addScalarFactory<Cosh>(*funcs);
	addScalarFactory<Tanh>(*funcs);
	addScalarFactory<ASinh>(*funcs);
	addScalarFactory<ACosh>(*funcs);
	addScalarFactory<ATanh>(*funcs);

	addScalarFactory<Pow>(*funcs);
	addScalarFactory<Exp>(*funcs);
	addScalarFactory<Log>(*funcs);
	addScalarFactory<Exp2>(*funcs);
	addScalarFactory<Log2>(*funcs);
	addScalarFactory<Sqrt>(*funcs);
	addScalarFactory<InverseSqrt>(*funcs);

	addScalarFactory<Abs>(*funcs);
	addScalarFactory<Sign>(*funcs);
	addScalarFactory<Floor>(*funcs);
	addScalarFactory<Trunc>(*funcs);
	addScalarFactory<Round>(*funcs);
	addScalarFactory<RoundEven>(*funcs);
	addScalarFactory<Ceil>(*funcs);
	addScalarFactory<Fract>(*funcs);
	addScalarFactory<Mod>(*funcs);
	funcs->addFactory(createSimpleFuncCaseFactory<Modf>());
	addScalarFactory<Min>(*funcs);
	addScalarFactory<Max>(*funcs);
	addScalarFactory<Clamp>(*funcs);
	addScalarFactory<Mix>(*funcs);
	addScalarFactory<Step>(*funcs);
	addScalarFactory<SmoothStep>(*funcs);

	funcs->addFactory(SharedPtr<const CaseFactory>(new TemplateFuncCaseFactory<Length>()));
	funcs->addFactory(SharedPtr<const CaseFactory>(new TemplateFuncCaseFactory<Distance>()));
	funcs->addFactory(SharedPtr<const CaseFactory>(new TemplateFuncCaseFactory<Dot>()));
	funcs->addFactory(createSimpleFuncCaseFactory<Cross>());
	funcs->addFactory(SharedPtr<const CaseFactory>(new TemplateFuncCaseFactory<Normalize>()));
	funcs->addFactory(SharedPtr<const CaseFactory>(new TemplateFuncCaseFactory<FaceForward>()));
	funcs->addFactory(SharedPtr<const CaseFactory>(new TemplateFuncCaseFactory<Reflect>()));
	funcs->addFactory(SharedPtr<const CaseFactory>(new TemplateFuncCaseFactory<Refract>()));


	funcs->addFactory(SharedPtr<const CaseFactory>(new MatrixFuncCaseFactory<MatrixCompMult>()));
	funcs->addFactory(SharedPtr<const CaseFactory>(new MatrixFuncCaseFactory<OuterProduct>()));
	funcs->addFactory(SharedPtr<const CaseFactory>(new MatrixFuncCaseFactory<Transpose>()));
	funcs->addFactory(SharedPtr<const CaseFactory>(new SquareMatrixFuncCaseFactory<Determinant>()));
	funcs->addFactory(SharedPtr<const CaseFactory>(new SquareMatrixFuncCaseFactory<Inverse>()));

	return MovePtr<const CaseFactories>(funcs.release());
}